

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O3

ExpressionBinder * __thiscall duckdb::Binder::GetActiveBinder(Binder *this)

{
  reference<Binder> root;
  reference pvVar1;
  shared_ptr<duckdb::Binder,_true> *this_00;
  
  if ((this->parent).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    this_00 = &this->parent;
    do {
      if (this->binder_type != REGULAR_BINDER) break;
      this = shared_ptr<duckdb::Binder,_true>::operator*(this_00);
      this_00 = &this->parent;
    } while ((this->parent).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr != (element_type *)0x0);
  }
  pvVar1 = vector<std::reference_wrapper<duckdb::ExpressionBinder>,_true>::back
                     (&this->active_binders);
  return pvVar1->_M_data;
}

Assistant:

ExpressionBinder &Binder::GetActiveBinder() {
	return GetActiveBinders().back();
}